

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

void __thiscall docopt::Command::Command(Command *this,string *name,value *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppbVar2;
  pointer pbVar3;
  undefined1 local_60 [8];
  undefined1 local_58 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_38._M_allocated_capacity = (size_type)(name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_allocated_capacity == paVar1) {
    local_28._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_28._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
    local_38._M_allocated_capacity = (size_type)&local_28;
  }
  else {
    local_28._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_38._8_8_ = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  local_60._0_4_ = v->kind;
  switch(local_60._0_4_) {
  case 1:
    local_58[0] = (v->variant).boolValue;
    break;
  case 2:
    local_58._0_8_ =
         (v->variant).strList.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    break;
  case 3:
    local_58._0_8_ = local_58 + 0x10;
    pbVar3 = (v->variant).strList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppbVar2 = &(v->variant).strList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pbVar3 == (pointer)ppbVar2) {
      local_58._16_8_ = *ppbVar2;
      local_58._24_8_ = *(undefined8 *)((long)&v->variant + 0x18);
    }
    else {
      local_58._16_8_ = *ppbVar2;
      local_58._0_8_ = pbVar3;
    }
    local_58._8_8_ = (v->variant).strValue._M_string_length;
    (v->variant).strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
    (v->variant).strValue._M_string_length = 0;
    *(undefined1 *)((long)&v->variant + 0x10) = 0;
    break;
  case 4:
    local_58._0_8_ =
         (v->variant).strList.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58._8_8_ = (v->variant).strValue._M_string_length;
    local_58._16_8_ =
         (v->variant).strList.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (v->variant).longValue = 0;
    (v->variant).strValue._M_string_length = 0;
    (v->variant).strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  LeafPattern::LeafPattern((LeafPattern *)this,(string *)&local_38,(value *)local_60);
  (this->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern =
       (_func_int **)&PTR_flat_001b9390;
  if (local_60._0_4_ == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
  }
  else if ((local_60._0_4_ == String) && ((pointer)local_58._0_8_ != (pointer)(local_58 + 0x10))) {
    operator_delete((void *)local_58._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_allocated_capacity != &local_28) {
    operator_delete((void *)local_38._M_allocated_capacity);
  }
  (this->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern =
       (_func_int **)&PTR_flat_001b93d8;
  return;
}

Assistant:

Command(std::string name, value v = value{false})
		: Argument(std::move(name), std::move(v))
		{}